

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

char * __thiscall
cmGeneratorTarget::GetFilePrefixInternal
          (cmGeneratorTarget *this,ArtifactType artifact,string *language)

{
  cmMakefile *pcVar1;
  TargetType TVar2;
  char *pcVar3;
  char *__lhs;
  ArtifactType artifact_00;
  string langPrefix;
  allocator<char> local_89;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  TVar2 = GetType(this);
  if (TVar2 == STATIC_LIBRARY) {
LAB_0027c2fa:
    if (artifact == ImportLibraryArtifact) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"CMAKE_IMPORT_LIBRARY_SUFFIX",(allocator<char> *)&local_68);
      pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      if (pcVar3 == (char *)0x0) goto LAB_0027c462;
    }
    TVar2 = GetType(this);
    artifact_00 = artifact;
    if (TVar2 != SHARED_LIBRARY) {
      TVar2 = GetType(this);
      if (TVar2 != MODULE_LIBRARY) {
        TVar2 = GetType(this);
        artifact_00 = RuntimeBinaryArtifact;
        if (TVar2 == EXECUTABLE) {
          artifact_00 = artifact;
        }
      }
    }
    if (artifact == ImportLibraryArtifact) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"IMPORT_PREFIX",(allocator<char> *)&local_68);
      pcVar3 = GetProperty(this,&local_88);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"PREFIX",(allocator<char> *)&local_68);
      pcVar3 = GetProperty(this,&local_88);
    }
    std::__cxx11::string::~string((string *)&local_88);
    if (pcVar3 == (char *)0x0) {
      __lhs = cmTarget::GetPrefixVariableInternal(this->Target,artifact_00);
      pcVar3 = (char *)0x0;
      if ((__lhs != (char *)0x0) && (language->_M_string_length != 0)) {
        if (*__lhs == '\0') {
          pcVar3 = (char *)0x0;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"_",&local_89);
          std::operator+(&local_68,__lhs,&local_48);
          std::operator+(&local_88,&local_68,language);
          std::__cxx11::string::~string((string *)&local_68);
          std::__cxx11::string::~string((string *)&local_48);
          pcVar3 = cmMakefile::GetDefinition(this->Makefile,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
        }
      }
      if (pcVar3 == (char *)0x0 && __lhs != (char *)0x0) {
        pcVar1 = this->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,__lhs,(allocator<char> *)&local_68);
        pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
    }
  }
  else {
    TVar2 = GetType(this);
    if (TVar2 == SHARED_LIBRARY) goto LAB_0027c2fa;
    TVar2 = GetType(this);
    if (TVar2 == MODULE_LIBRARY) goto LAB_0027c2fa;
    TVar2 = GetType(this);
    if (TVar2 == EXECUTABLE) goto LAB_0027c2fa;
LAB_0027c462:
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

const char* cmGeneratorTarget::GetFilePrefixInternal(
  cmStateEnums::ArtifactType artifact, const std::string& language) const
{
  // no prefix for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    return nullptr;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty prefix for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact &&
      !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
    return nullptr;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute prefix value.
  const char* targetPrefix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_PREFIX")
                               : this->GetProperty("PREFIX"));

  if (!targetPrefix) {
    const char* prefixVar = this->Target->GetPrefixVariableInternal(artifact);
    if (!language.empty() && prefixVar && *prefixVar) {
      std::string langPrefix = prefixVar + std::string("_") + language;
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
    }

    // if there is no prefix on the target nor specific language
    // use the cmake definition.
    if (!targetPrefix && prefixVar) {
      targetPrefix = this->Makefile->GetDefinition(prefixVar);
    }
  }

  return targetPrefix;
}